

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::Expr::set_parent(Expr *this)

{
  int iVar1;
  VarType VVar2;
  int iVar3;
  undefined4 extraout_var;
  Generator *pGVar4;
  Generator *pGVar5;
  Generator *pGVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  Generator *local_58;
  Generator *right_gen;
  Generator *left_gen;
  Expr *this_local;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if (this->right == (Var *)0x0) {
    iVar1 = (*(this->left->super_IRNode)._vptr_IRNode[0xd])();
    (this->super_Var).generator_ = (Generator *)CONCAT44(extraout_var,iVar1);
  }
  else {
    iVar1 = (*(this->left->super_IRNode)._vptr_IRNode[0xd])();
    pGVar4 = (Generator *)CONCAT44(extraout_var_00,iVar1);
    iVar1 = (*(this->right->super_IRNode)._vptr_IRNode[0xd])();
    pGVar5 = (Generator *)CONCAT44(extraout_var_01,iVar1);
    pGVar6 = Const::const_gen();
    if (pGVar4 == pGVar6) {
      (this->super_Var).generator_ = pGVar5;
    }
    else {
      pGVar6 = Const::const_gen();
      if ((pGVar5 == pGVar6) || (pGVar5 == (Generator *)0x0)) {
        (this->super_Var).generator_ = pGVar4;
      }
      else if (pGVar4 == pGVar5) {
        iVar1 = (*(this->left->super_IRNode)._vptr_IRNode[0xd])();
        (this->super_Var).generator_ = (Generator *)CONCAT44(extraout_var_02,iVar1);
      }
      else {
        iVar1 = (*(pGVar5->super_IRNode)._vptr_IRNode[4])();
        if ((pGVar4 == (Generator *)CONCAT44(extraout_var_03,iVar1)) &&
           (VVar2 = Var::type(this->right), VVar2 == PortIO)) {
          (this->super_Var).generator_ = pGVar4;
        }
        else {
          iVar1 = (*(pGVar4->super_IRNode)._vptr_IRNode[4])();
          iVar3 = (*(pGVar5->super_IRNode)._vptr_IRNode[4])();
          if ((CONCAT44(extraout_var_04,iVar1) == CONCAT44(extraout_var_05,iVar3)) &&
             ((VVar2 = Var::type(this->left), VVar2 == PortIO &&
              (VVar2 = Var::type(this->right), VVar2 == PortIO)))) {
            iVar1 = (*(pGVar4->super_IRNode)._vptr_IRNode[4])();
            if (CONCAT44(extraout_var_06,iVar1) == 0) {
              local_58 = (Generator *)0x0;
            }
            else {
              local_58 = (Generator *)
                         __dynamic_cast(CONCAT44(extraout_var_06,iVar1),&IRNode::typeinfo,
                                        &Generator::typeinfo,0);
            }
            (this->super_Var).generator_ = local_58;
          }
          else {
            (this->super_Var).generator_ = pGVar5;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Expr::set_parent() {
    // compute the right parent for the expr
    // it can only go up
    if (!right) {
        generator_ = left->generator();
    } else {
        auto *left_gen = left->generator();
        auto *right_gen = right->generator();
        if (left_gen == Const::const_gen()) {
            generator_ = right_gen;
        } else if (right_gen == Const::const_gen() || !right_gen) {
            generator_ = left_gen;
        } else if (left_gen == right_gen) {
            generator_ = left->generator();
        } else {
            // choose the higher/lower one based on the var type
            if (left_gen == right_gen->parent() && right->type() == VarType::PortIO) {
                generator_ = left_gen;
            } else if (left_gen->parent() == right_gen->parent() &&
                       left->type() == VarType::PortIO && right->type() == VarType::PortIO) {
                generator_ = dynamic_cast<Generator *>(left_gen->parent());
            } else {
                generator_ = right_gen;
            }
        }
    }
}